

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcTextSize(char *text,char *text_end,bool hide_text_after_double_hash,
                          float wrap_width)

{
  float _y;
  ImFont *pIVar1;
  ImGuiContext *pIVar2;
  byte in_DL;
  char *in_RSI;
  char *in_RDI;
  float character_spacing_x;
  char **unaff_retaddr;
  float font_scale;
  float font_size;
  ImFont *font;
  char *text_display_end;
  ImGuiContext *g;
  undefined3 in_stack_0000002c;
  ImVec2 text_size;
  char *local_30;
  ImVec2 local_8;
  
  pIVar2 = GImGui;
  local_30 = in_RSI;
  if ((in_DL & 1) != 0) {
    local_30 = FindRenderedTextEnd(in_RDI,in_RSI);
  }
  pIVar1 = pIVar2->Font;
  _y = pIVar2->FontSize;
  if (in_RDI == local_30) {
    ImVec2::ImVec2(&local_8,0.0,_y);
  }
  else {
    local_8 = ImFont::CalcTextSizeA
                        ((ImFont *)CONCAT44(_in_stack_0000002c,wrap_width),g._4_4_,g._0_4_,
                         text_display_end._4_4_,(char *)font,_font_scale,unaff_retaddr);
    if (0.0 < local_8.x) {
      local_8.x = local_8.x - (_y / pIVar1->FontSize) * 1.0;
    }
    local_8.x = (float)(int)(local_8.x + 0.95);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::CalcTextSize(const char* text, const char* text_end, bool hide_text_after_double_hash, float wrap_width)
{
    ImGuiContext& g = *GImGui;

    const char* text_display_end;
    if (hide_text_after_double_hash)
        text_display_end = FindRenderedTextEnd(text, text_end);      // Hide anything after a '##' string
    else
        text_display_end = text_end;

    ImFont* font = g.Font;
    const float font_size = g.FontSize;
    if (text == text_display_end)
        return ImVec2(0.0f, font_size);
    ImVec2 text_size = font->CalcTextSizeA(font_size, FLT_MAX, wrap_width, text, text_display_end, NULL);

    // Cancel out character spacing for the last character of a line (it is baked into glyph->AdvanceX field)
    const float font_scale = font_size / font->FontSize;
    const float character_spacing_x = 1.0f * font_scale;
    if (text_size.x > 0.0f)
        text_size.x -= character_spacing_x;
    text_size.x = (float)(int)(text_size.x + 0.95f);

    return text_size;
}